

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

int __thiscall
ON_SimpleArray<ON_UUID_struct>::BinarySearch
          (ON_SimpleArray<ON_UUID_struct> *this,ON_UUID_struct *key,
          _func_int_ON_UUID_struct_ptr_ON_UUID_struct_ptr *compar)

{
  void *local_60;
  ON__UINT64 i;
  ON__UINT64 sz;
  ON__UINT64 aptr;
  ON__UINT64 fptr;
  int rc;
  ON_UUID_struct *found;
  _func_int_ON_UUID_struct_ptr_ON_UUID_struct_ptr *compar_local;
  ON_UUID_struct *key_local;
  ON_SimpleArray<ON_UUID_struct> *this_local;
  
  if (((key == (ON_UUID_struct *)0x0) || (this->m_a == (ON_UUID_struct *)0x0)) ||
     (this->m_count < 1)) {
    local_60 = (void *)0x0;
  }
  else {
    local_60 = bsearch(key,this->m_a,(long)this->m_count,0x10,(__compar_fn_t)compar);
  }
  if (local_60 == (void *)0x0) {
    fptr._4_4_ = -1;
  }
  else {
    fptr._4_4_ = (int)((ulong)((long)local_60 - (long)this->m_a) >> 4);
  }
  return fptr._4_4_;
}

Assistant:

int ON_SimpleArray<T>::BinarySearch( const T* key, int (*compar)(const T*,const T*) ) const
{
  const T* found = (nullptr != key && nullptr != m_a && m_count>0)
                 ? (const T*)bsearch( key, m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar ) 
                 : nullptr;

  // This worked on a wide range of 32 bit compilers.

  int rc;
  if ( 0 != found )
  {
    // Convert "found" pointer to array index.

#if defined(ON_COMPILER_MSC1300)
    rc = ((int)(found - m_a));
#elif 8 == ON_SIZEOF_POINTER
    // In an ideal world, return ((int)(found - m_a)) would work everywhere.
    // In practice, this should work any 64 bit compiler and we can hope
    // the optimzer generates efficient code.
    const ON__UINT64 fptr = (ON__UINT64)found;
    const ON__UINT64 aptr = (ON__UINT64)m_a;
    const ON__UINT64 sz   = (ON__UINT64)sizeof(T);
    const ON__UINT64 i    = (fptr - aptr)/sz;
    rc = (int)i;
#else
    // In an ideal world, return ((int)(found - m_a)) would work everywhere.
    // In practice, this should work any 32 bit compiler and we can hope
    // the optimzer generates efficient code.
    const ON__UINT32 fptr = (ON__UINT32)found;
    const ON__UINT32 aptr = (ON__UINT32)m_a;
    const ON__UINT32 sz   = (ON__UINT32)sizeof(T);
    const ON__UINT32 i    = (fptr - aptr)/sz;
    rc = (int)i;
#endif
  }
  else
  {
    // "key" not found
    rc = -1;
  }

  return rc;

}